

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallGetRuntimeDependenciesGenerator.cxx
# Opt level: O0

void anon_unknown.dwarf_cec6d5::WriteGenexEvaluatorArgument
               (ostream *os,string_view *keyword,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *genexes,string *config,cmLocalGenerator *lg,cmScriptGeneratorIndent indent)

{
  anon_class_40_2_fbf6b09c local_68;
  cmScriptGeneratorIndent local_3c;
  cmLocalGenerator *local_38;
  cmLocalGenerator *lg_local;
  string *config_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *genexes_local;
  string_view *keyword_local;
  ostream *os_local;
  cmScriptGeneratorIndent indent_local;
  
  local_3c.Level = indent.Level;
  local_38 = lg;
  lg_local = (cmLocalGenerator *)config;
  config_local = (string *)genexes;
  genexes_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)keyword;
  keyword_local = (string_view *)os;
  os_local._4_4_ = indent.Level;
  std::__cxx11::string::string((string *)&local_68,(string *)config);
  local_68.lg = local_38;
  (anonymous_namespace)::
  WriteMultiArgument<std::__cxx11::string,(anonymous_namespace)::WriteGenexEvaluatorArgument(std::ostream&,std::basic_string_view<char,std::char_traits<char>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::__cxx11::string_const&,cmLocalGenerator*,cmScriptGeneratorIndent)::__0>
            (os,keyword,genexes,local_3c,&local_68);
  (anonymous_namespace)::
  WriteGenexEvaluatorArgument(std::ostream&,std::basic_string_view<char,std::char_traits<char>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::__cxx11::string_const&,cmLocalGenerator*,cmScriptGeneratorIndent)
  ::$_0::~__0((__0 *)&local_68);
  return;
}

Assistant:

void WriteGenexEvaluatorArgument(std::ostream& os,
                                 const cm::string_view& keyword,
                                 const std::vector<std::string>& genexes,
                                 const std::string& config,
                                 cmLocalGenerator* lg,
                                 cmScriptGeneratorIndent indent)
{
  WriteMultiArgument(
    os, keyword, genexes, indent,
    [config, lg](const std::string& genex) -> cm::optional<std::string> {
      std::string result = cmGeneratorExpression::Evaluate(genex, lg, config);
      if (result.empty()) {
        return cm::nullopt;
      }
      return cmOutputConverter::EscapeForCMake(result);
    });
}